

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void httplib::detail::set_nonblocking(socket_t sock,bool nonblocking)

{
  uint uVar1;
  undefined7 in_register_00000031;
  
  uVar1 = fcntl(sock,3,0);
  fcntl(sock,4,(ulong)((int)CONCAT71(in_register_00000031,nonblocking) << 0xb | uVar1 & 0xfffff7ff))
  ;
  return;
}

Assistant:

inline void set_nonblocking(socket_t sock, bool nonblocking) {
#ifdef _WIN32
  auto flags = nonblocking ? 1UL : 0UL;
  ioctlsocket(sock, FIONBIO, &flags);
#else
  auto flags = fcntl(sock, F_GETFL, 0);
  fcntl(sock, F_SETFL,
        nonblocking ? (flags | O_NONBLOCK) : (flags & (~O_NONBLOCK)));
#endif
}